

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int __thiscall AActor::GetTeam(AActor *this)

{
  int iVar1;
  
  if (this->player != (player_t *)0x0) {
    iVar1 = userinfo_t::GetTeam(&this->player->userinfo);
    return iVar1;
  }
  iVar1 = this->DesignatedTeam;
  if (iVar1 == 0xff) {
    if (this->FriendPlayer != 0) {
      iVar1 = userinfo_t::GetTeam((userinfo_t *)
                                  (&DAT_009ba458 + (ulong)(this->FriendPlayer - 1) * 0x2a0));
      return iVar1;
    }
    iVar1 = 0xff;
  }
  return iVar1;
}

Assistant:

int AActor::GetTeam()
{
	if (player)
	{
		return player->userinfo.GetTeam();
	}

	int myTeam = DesignatedTeam;

	// Check for monsters that belong to a player on the team but aren't part of the team themselves.
	if (myTeam == TEAM_NONE && FriendPlayer != 0)
	{
		myTeam = players[FriendPlayer - 1].userinfo.GetTeam();
	}
	return myTeam;

}